

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_q.c
# Opt level: O0

float64 best_q(float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,
              uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,uint32 **dfeat,
              uint32 n_dfeat,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 *id,uint32 n_id,
              float32 ***dist,float64 node_wt_ent,quest_t **out_best_q)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  cmd_ln_t *pcVar5;
  char *__s1;
  undefined8 *inptr;
  undefined8 *inptr_00;
  void *ptr;
  void *ptr_00;
  bool bVar6;
  double dVar7;
  double dVar8;
  float64 fVar9;
  uint local_108;
  uint32 sumveclen;
  uint32 continuous;
  char *type;
  float64 b_einc;
  float64 einc;
  uint local_e0;
  uint32 ii;
  uint32 s;
  uint32 b_q;
  uint32 q;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_b_no;
  uint32 n_no;
  uint32 n_b_yes;
  uint32 n_yes;
  uint32 *no_id;
  float64 no_norm;
  float64 no_dnom;
  float64 n_ent;
  float32 ***no_vars;
  float32 ***no_means;
  float32 ***no_dist;
  uint32 *yes_id;
  float64 yes_norm;
  float64 yes_dnom;
  float64 y_ent;
  undefined8 *puStack_58;
  float32 varfloor;
  float32 ***yes_vars;
  float32 ***yes_means;
  float32 ***yes_dist;
  float64 node_wt_ent_local;
  uint32 n_state_local;
  uint32 n_model_local;
  uint32 *veclen_local;
  float32 ****vars_local;
  float32 ****means_local;
  float32 ****mixw_local;
  
  yes_vars = (float32 ***)0x0;
  puStack_58 = (undefined8 *)0x0;
  y_ent._4_4_ = 0.0;
  no_vars = (float32 ***)0x0;
  n_ent = 0.0;
  n_b_no = 0;
  j = 0;
  ii = 0;
  type = (char *)0xca511b0ec57e649a;
  local_108 = 0;
  pcVar5 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar5,"-ts2cbfn");
  iVar4 = strcmp(__s1,".semi.");
  if ((iVar4 != 0) && (iVar4 = strcmp(__s1,".cont."), iVar4 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
            ,0x67,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
    exit(1);
  }
  iVar4 = strcmp(__s1,".cont.");
  bVar6 = iVar4 == 0;
  if (bVar6) {
    pcVar5 = cmd_ln_get();
    dVar7 = cmd_ln_float_r(pcVar5,"-varfloor");
    y_ent._4_4_ = (float)dVar7;
    local_108 = 0;
    for (einc._4_4_ = 0; einc._4_4_ < n_stream; einc._4_4_ = einc._4_4_ + 1) {
      local_108 = veclen[einc._4_4_] + local_108;
    }
    yes_vars = (float32 ***)
               __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)local_108,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x71);
    puStack_58 = (undefined8 *)
                 __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)local_108,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                   ,0x72);
    no_vars = (float32 ***)
              __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)local_108,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                ,0x73);
    n_ent = (float64)__ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)local_108,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                       ,0x74);
  }
  inptr = (undefined8 *)
          __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)n_density,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                            ,0x79);
  inptr_00 = (undefined8 *)
             __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                               ,0x7a);
  s = 0;
  do {
    if (n_all_q <= s) {
      if ((n_b_no == 0) || (j == 0)) {
        *out_best_q = (quest_t *)0x0;
        mixw_local = (float32 ****)0x0;
      }
      else {
        ptr = __ckd_calloc__((ulong)n_b_no,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                             ,0x112);
        ptr_00 = __ckd_calloc__((ulong)j,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                ,0x113);
        memset(*(void **)*inptr,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)n_density);
        memset(*(void **)*inptr_00,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)n_density);
        i = 0;
        n_no = 0;
        for (einc._4_4_ = 0; einc._4_4_ < n_id; einc._4_4_ = einc._4_4_ + 1) {
          uVar2 = id[einc._4_4_];
          iVar4 = eval_quest(all_q + ii,dfeat[uVar2],n_dfeat);
          if (iVar4 == 0) {
            for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
              for (q = 0; q < n_stream; q = q + 1) {
                for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
                  lVar3 = *(long *)(inptr_00[local_e0] + (ulong)q * 8);
                  *(float *)(lVar3 + (ulong)b_q * 4) =
                       (float)mixw[uVar2][local_e0][q][b_q] + *(float *)(lVar3 + (ulong)b_q * 4);
                }
              }
            }
            *(uint *)((long)ptr_00 + (ulong)i * 4) = uVar2;
            i = i + 1;
          }
          else {
            for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
              for (q = 0; q < n_stream; q = q + 1) {
                for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
                  lVar3 = *(long *)(inptr[local_e0] + (ulong)q * 8);
                  *(float *)(lVar3 + (ulong)b_q * 4) =
                       (float)mixw[uVar2][local_e0][q][b_q] + *(float *)(lVar3 + (ulong)b_q * 4);
                }
              }
            }
            *(uint *)((long)ptr + (ulong)n_no * 4) = uVar2;
            n_no = n_no + 1;
          }
        }
        ckd_free_3d(inptr);
        ckd_free(ptr);
        ckd_free_3d(inptr_00);
        ckd_free(ptr_00);
        if (bVar6) {
          ckd_free_3d(yes_vars);
          ckd_free_3d(puStack_58);
          ckd_free_3d(no_vars);
          ckd_free_3d((void *)n_ent);
        }
        *out_best_q = all_q + ii;
        mixw_local = (float32 ****)type;
      }
      return (float64)mixw_local;
    }
    memset(*(void **)*inptr,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)n_density);
    memset(*(void **)*inptr_00,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)n_density);
    if (bVar6) {
      memset(**yes_vars,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)local_108);
      memset(*(void **)*puStack_58,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)local_108);
      memset(**no_vars,0,(ulong)n_state * 4 * (ulong)n_stream * (ulong)local_108);
      memset((void *)**(undefined8 **)n_ent,0,
             (ulong)n_state * 4 * (ulong)n_stream * (ulong)local_108);
    }
    i = 0;
    n_no = 0;
    for (einc._4_4_ = 0; einc._4_4_ < n_id; einc._4_4_ = einc._4_4_ + 1) {
      uVar2 = id[einc._4_4_];
      iVar4 = eval_quest(all_q + s,dfeat[uVar2],n_dfeat);
      if (iVar4 == 0) {
        for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
          for (q = 0; q < n_stream; q = q + 1) {
            for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
              lVar3 = *(long *)(inptr_00[local_e0] + (ulong)q * 8);
              *(float *)(lVar3 + (ulong)b_q * 4) =
                   (float)mixw[uVar2][local_e0][q][b_q] + *(float *)(lVar3 + (ulong)b_q * 4);
            }
          }
        }
        if (bVar6) {
          for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
            for (q = 0; q < n_stream; q = q + 1) {
              for (b_q = 0; b_q < veclen[q]; b_q = b_q + 1) {
                no_vars[local_e0][q][b_q] =
                     (float32)((float)*mixw[uVar2][local_e0][q] *
                               (float)means[uVar2][local_e0][q][b_q] +
                              (float)no_vars[local_e0][q][b_q]);
                lVar3 = *(long *)(*(long *)((long)n_ent + (ulong)local_e0 * 8) + (ulong)q * 8);
                *(float *)(lVar3 + (ulong)b_q * 4) =
                     (float)*mixw[uVar2][local_e0][q] *
                     ((float)means[uVar2][local_e0][q][b_q] * (float)means[uVar2][local_e0][q][b_q]
                     + (float)vars[uVar2][local_e0][q][b_q]) + *(float *)(lVar3 + (ulong)b_q * 4);
              }
            }
          }
        }
        i = i + 1;
      }
      else {
        for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
          for (q = 0; q < n_stream; q = q + 1) {
            for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
              lVar3 = *(long *)(inptr[local_e0] + (ulong)q * 8);
              *(float *)(lVar3 + (ulong)b_q * 4) =
                   (float)mixw[uVar2][local_e0][q][b_q] + *(float *)(lVar3 + (ulong)b_q * 4);
            }
          }
        }
        if (bVar6) {
          for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
            for (q = 0; q < n_stream; q = q + 1) {
              for (b_q = 0; b_q < veclen[q]; b_q = b_q + 1) {
                yes_vars[local_e0][q][b_q] =
                     (float32)((float)*mixw[uVar2][local_e0][q] *
                               (float)means[uVar2][local_e0][q][b_q] +
                              (float)yes_vars[local_e0][q][b_q]);
                lVar3 = *(long *)(puStack_58[local_e0] + (ulong)q * 8);
                *(float *)(lVar3 + (ulong)b_q * 4) =
                     (float)*mixw[uVar2][local_e0][q] *
                     ((float)means[uVar2][local_e0][q][b_q] * (float)means[uVar2][local_e0][q][b_q]
                     + (float)vars[uVar2][local_e0][q][b_q]) + *(float *)(lVar3 + (ulong)b_q * 4);
              }
            }
          }
        }
        n_no = n_no + 1;
      }
    }
    if ((n_no != 0) && (i != 0)) {
      b_einc = 0.0;
      for (local_e0 = 0; local_e0 < n_state; local_e0 = local_e0 + 1) {
        yes_norm = 0.0;
        for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
          yes_norm = (float64)((double)*(float *)(*(long *)inptr[local_e0] + (ulong)b_q * 4) +
                              (double)yes_norm);
        }
        if (((double)yes_norm == 0.0) && (!NAN((double)yes_norm))) break;
        dVar7 = 1.0 / (double)yes_norm;
        for (q = 0; q < n_stream; q = q + 1) {
          for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
            lVar3 = *(long *)(inptr[local_e0] + (ulong)q * 8);
            *(float *)(lVar3 + (ulong)b_q * 4) =
                 (float)((double)*(float *)(lVar3 + (ulong)b_q * 4) * dVar7);
          }
        }
        no_norm = 0.0;
        for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
          no_norm = (float64)((double)*(float *)(*(long *)inptr_00[local_e0] + (ulong)b_q * 4) +
                             (double)no_norm);
        }
        if (((double)no_norm == 0.0) && (!NAN((double)no_norm))) break;
        dVar8 = 1.0 / (double)no_norm;
        for (q = 0; q < n_stream; q = q + 1) {
          for (b_q = 0; b_q < n_density; b_q = b_q + 1) {
            lVar3 = *(long *)(inptr_00[local_e0] + (ulong)q * 8);
            *(float *)(lVar3 + (ulong)b_q * 4) =
                 (float)((double)*(float *)(lVar3 + (ulong)b_q * 4) * dVar8);
          }
        }
        if (bVar6) {
          yes_dnom = 0.0;
          no_dnom = 0.0;
          for (q = 0; q < n_stream; q = q + 1) {
            if (((double)yes_norm != 0.0) || (NAN((double)yes_norm))) {
              for (b_q = 0; b_q < veclen[q]; b_q = b_q + 1) {
                yes_vars[local_e0][q][b_q] =
                     (float32)(float)((double)(float)yes_vars[local_e0][q][b_q] * dVar7);
                *(float *)(*(long *)(puStack_58[local_e0] + (ulong)q * 8) + (ulong)b_q * 4) =
                     (float)((double)*(float *)(*(long *)(puStack_58[local_e0] + (ulong)q * 8) +
                                               (ulong)b_q * 4) * dVar7 +
                            -(double)((float)yes_vars[local_e0][q][b_q] *
                                     (float)yes_vars[local_e0][q][b_q]));
                if (*(float *)(*(long *)(puStack_58[local_e0] + (ulong)q * 8) + (ulong)b_q * 4) <
                    y_ent._4_4_) {
                  *(float *)(*(long *)(puStack_58[local_e0] + (ulong)q * 8) + (ulong)b_q * 4) =
                       y_ent._4_4_;
                }
              }
            }
            if (((double)no_norm != 0.0) || (NAN((double)no_norm))) {
              for (b_q = 0; b_q < veclen[q]; b_q = b_q + 1) {
                no_vars[local_e0][q][b_q] =
                     (float32)(float)((double)(float)no_vars[local_e0][q][b_q] * dVar8);
                *(float *)(*(long *)(*(long *)((long)n_ent + (ulong)local_e0 * 8) + (ulong)q * 8) +
                          (ulong)b_q * 4) =
                     (float)((double)*(float *)(*(long *)(*(long *)((long)n_ent +
                                                                   (ulong)local_e0 * 8) +
                                                         (ulong)q * 8) + (ulong)b_q * 4) * dVar8 +
                            -(double)((float)no_vars[local_e0][q][b_q] *
                                     (float)no_vars[local_e0][q][b_q]));
                if (*(float *)(*(long *)(*(long *)((long)n_ent + (ulong)local_e0 * 8) + (ulong)q * 8
                                        ) + (ulong)b_q * 4) < y_ent._4_4_) {
                  *(float *)(*(long *)(*(long *)((long)n_ent + (ulong)local_e0 * 8) + (ulong)q * 8)
                            + (ulong)b_q * 4) = y_ent._4_4_;
                }
              }
            }
            fVar9 = ent_cont(yes_vars[local_e0][q],
                             *(float32 **)(puStack_58[local_e0] + (ulong)q * 8),veclen[q]);
            yes_dnom = (float64)((double)yes_norm * (double)fVar9 + (double)yes_dnom);
            fVar9 = ent_cont(no_vars[local_e0][q],
                             *(float32 **)
                              (*(long *)((long)n_ent + (ulong)local_e0 * 8) + (ulong)q * 8),
                             veclen[q]);
            no_dnom = (float64)((double)no_norm * (double)fVar9 + (double)no_dnom);
          }
          dVar7 = (double)(float)stwt[local_e0] * ((double)yes_dnom + (double)no_dnom);
        }
        else {
          fVar1 = (float)stwt[local_e0];
          fVar9 = wt_ent_inc((float32 **)inptr[local_e0],(float32)(float)(double)yes_norm,
                             (float32 **)inptr_00[local_e0],(float32)(float)(double)no_norm,
                             dist[local_e0],n_stream,n_density);
          dVar7 = (double)fVar1 * (double)fVar9;
        }
        b_einc = (float64)(dVar7 + (double)b_einc);
      }
      if (bVar6) {
        b_einc = (float64)((double)b_einc - (double)node_wt_ent);
      }
      if ((n_state <= local_e0) && ((double)type < (double)b_einc)) {
        type = (char *)b_einc;
        ii = s;
        n_b_no = n_no;
        j = i;
      }
    }
    s = s + 1;
  } while( true );
}

Assistant:

float64
best_q(float32 ****mixw,
       float32 ****means,
       float32 ****vars,
       uint32  *veclen,
       uint32 n_model,
       uint32 n_state,
       uint32 n_stream,
       uint32 n_density,
       float32 *stwt,
       uint32 **dfeat,
       uint32 n_dfeat,
       quest_t *all_q,
       uint32 n_all_q,
       pset_t *pset,
       uint32 *id,
       uint32 n_id,
       float32 ***dist,
       float64 node_wt_ent,  /* Weighted entropy of node */
       quest_t **out_best_q)
{
    float32 ***yes_dist;
    float32 ***yes_means=0;
    float32 ***yes_vars=0;
    float32 varfloor=0;
    float64 y_ent;
    float64 yes_dnom, yes_norm;
    uint32 *yes_id;
    float32 ***no_dist;
    float32 ***no_means=0;
    float32 ***no_vars=0;
    float64 n_ent;
    float64 no_dnom, no_norm;
    uint32 *no_id;
    uint32 n_yes, n_b_yes = 0;
    uint32 n_no, n_b_no = 0;
    uint32 i, j, k, q, b_q=0, s;
    uint32 ii;
    float64 einc, b_einc = -1.0e+50;

    const char*  type;
    uint32 continuous, sumveclen=0;

    type = cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0)
        continuous = 1;
    else
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Allocating for sumveclen is overallocation, but it eases coding */
        for (ii=0,sumveclen=0;ii<n_stream;ii++) sumveclen += veclen[ii];
        yes_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        yes_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    n_yes = n_no = 0;

    yes_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    no_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    for (q = 0; q < n_all_q; q++) {
	memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
	memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);

        if (continuous == 1) {
	    memset(&yes_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&yes_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
        }

	n_yes = n_no = 0;

	for (ii = 0; ii < n_id; ii++) {
	    i = id[ii];
	    if (eval_quest(&all_q[q], dfeat[i], n_dfeat)) {
	        for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    yes_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                yes_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                yes_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_yes;
	    }
	    else {
		for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    no_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                no_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                no_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_no;
	    }
	}
	
	if ((n_yes == 0) || (n_no == 0)) {
	    /* no split.  All satisfy or all don't satisfy */
	    continue;
	}


	for (s = 0, einc = 0; s < n_state; s++) {
	    for (k = 0, yes_dnom = 0; k < n_density; k++) {
		yes_dnom += yes_dist[s][0][k];
	    }
	
	    if (yes_dnom == 0)
	      break;

	    yes_norm = 1.0 / yes_dnom;
	
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    yes_dist[s][j][k] *= yes_norm;
		}
	    }
	
	    for (k = 0, no_dnom = 0; k < n_density; k++) {
		no_dnom += no_dist[s][0][k];
	    }
	
	    if (no_dnom == 0)
	      break;

	    no_norm = 1.0 / no_dnom;
	    
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    no_dist[s][j][k] *= no_norm;
		}
	    }

            if (continuous == 1) {
                y_ent = 0;
                n_ent = 0;
	        for (j = 0; j < n_stream; j++) {
                    if (yes_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            yes_means[s][j][k] *= yes_norm;
                            yes_vars[s][j][k] = yes_vars[s][j][k]*yes_norm - 
                                          yes_means[s][j][k]*yes_means[s][j][k];
                            if (yes_vars[s][j][k] < varfloor) yes_vars[s][j][k] = varfloor;
                        }
                    }
                    if (no_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            no_means[s][j][k] *= no_norm;
                            no_vars[s][j][k] = no_vars[s][j][k]*no_norm - 
                                            no_means[s][j][k]*no_means[s][j][k];
                            if (no_vars[s][j][k] < varfloor) no_vars[s][j][k] = varfloor;
                        }
                    }
                    y_ent +=  yes_dnom * ent_cont(yes_means[s][j],yes_vars[s][j],veclen[j]);
                    n_ent +=  no_dnom * ent_cont(no_means[s][j],no_vars[s][j],veclen[j]);
                }
                einc += (float64)stwt[s] * (y_ent + n_ent);
            }
            else {
	        einc += (float64)stwt[s] * wt_ent_inc(yes_dist[s], yes_dnom,
	    				     no_dist[s], no_dnom,
					     dist[s], n_stream, n_density);
            }
	}

        if (continuous == 1) {
            einc -=  node_wt_ent;
        }

	if (s < n_state) {
	  /* Ended iteration over states prematurely; assume 'bad' question */
	  continue;
	}
	
	if (einc > b_einc) {
	    b_einc = einc;
	    b_q = q;
	    n_b_yes = n_yes;
	    n_b_no = n_no;
	}
    }

    if ((n_b_yes == 0) || (n_b_no == 0)) {
	/* No best question */
	*out_best_q = NULL;

	return 0;
    }

    yes_id = (uint32 *)ckd_calloc(n_b_yes, sizeof(uint32));
    no_id  = (uint32 *)ckd_calloc(n_b_no, sizeof(uint32));

    memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    n_yes = n_no = 0;

    for (ii = 0; ii < n_id; ii++) {
	i = id[ii];
	if (eval_quest(&all_q[b_q], dfeat[i], n_dfeat)) {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			yes_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    yes_id[n_yes] = i;
	    ++n_yes;
	}
	else {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			no_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    no_id[n_no] = i;
	    ++n_no;
	}
    }
    
    ckd_free_3d((void ***)yes_dist);
    ckd_free((void *)yes_id);
    ckd_free_3d((void ***)no_dist);
    ckd_free((void *)no_id);

    if (continuous == 1) {
        ckd_free_3d((void ***)yes_means);
        ckd_free_3d((void ***)yes_vars);
        ckd_free_3d((void ***)no_means);
        ckd_free_3d((void ***)no_vars);
    }

    *out_best_q = &all_q[b_q];

    return b_einc;
}